

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

int set_add(void *av,void *t)

{
  uint uVar1;
  void *pvVar2;
  uint uVar3;
  ulong uVar4;
  void *pvVar5;
  int iVar6;
  AbstractVec vv;
  uint local_40 [2];
  void *local_38;
  
  do {
    uVar1 = *av;
    if (uVar1 == 0) {
      local_38 = (void *)0x0;
      *(undefined4 *)((long)av + 4) = 2;
      uVar4 = 2;
    }
    else {
      local_38 = *(void **)((long)av + 8);
      iVar6 = 5;
      uVar4 = (ulong)t & 0xffffffff;
      do {
        uVar4 = uVar4 % (ulong)uVar1;
        pvVar2 = *(void **)((long)local_38 + uVar4 * 8);
        if (pvVar2 == (void *)0x0) {
          *(void **)((long)local_38 + uVar4 * 8) = t;
          return 1;
        }
        if (pvVar2 == t) {
          return 0;
        }
        uVar4 = (ulong)((int)uVar4 + 1);
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
      uVar3 = *(int *)((long)av + 4) + 1;
      uVar4 = (ulong)uVar3;
      *(uint *)((long)av + 4) = uVar3;
      local_40[0] = uVar1;
    }
    pvVar2 = local_38;
    uVar1 = d_prime2[uVar4];
    *(uint *)av = uVar1;
    pvVar5 = calloc(1,(ulong)uVar1 << 3);
    *(void **)((long)av + 8) = pvVar5;
    if (pvVar2 != (void *)0x0) {
      set_union(av,local_40);
      free(pvVar2);
    }
  } while( true );
}

Assistant:

int set_add(void *av, void *t) {
  AbstractVec *v = (AbstractVec *)av, vv;
  int j, n = v->n;
  uint i;
  if (n) {
    uint h = ((uintptr_t)t);
    h = h % n;
    for (i = h, j = 0; i < v->n && j < SET_MAX_SEQUENTIAL; i = ((i + 1) % n), j++) {
      if (!v->v[i]) {
        v->v[i] = t;
        return 1;
      } else if (v->v[i] == t)
        return 0;
    }
  }
  if (!n) {
    vv.v = NULL;
    v->i = INITIAL_SET_SIZE_INDEX;
  } else {
    vv.v = v->v;
    vv.n = v->n;
    v->i = v->i + 1;
  }
  v->n = d_prime2[v->i];
  v->v = (void **)MALLOC(v->n * sizeof(void *));
  memset(v->v, 0, v->n * sizeof(void *));
  if (vv.v) {
    set_union(av, &vv);
    FREE(vv.v);
  }
  return set_add(v, t);
}